

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

GenericTrack * __thiscall
ASDCP::MXF::GenericTrack::InitFromTLVSet(GenericTrack *this,TLVReader *TLVSet)

{
  int iVar1;
  MDDEntry *pMVar2;
  MDDEntry *in_RDX;
  TLVReader local_80;
  
  if (TLVSet[1].super_MemIOReader.m_p != (byte_t *)0x0) {
    InterchangeObject::InitFromTLVSet(&this->super_InterchangeObject,TLVSet);
    if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
      pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_GenericTrack_TrackID);
      TLVReader::ReadUi32(&local_80,in_RDX,(ui32_t *)pMVar2);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
        pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                  MDD_GenericTrack_TrackNumber);
        TLVReader::ReadUi32(&local_80,in_RDX,(ui32_t *)pMVar2);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
        Kumu::Result_t::~Result_t((Result_t *)&local_80);
        if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
          pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                    MDD_GenericTrack_TrackName);
          TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
          Kumu::Result_t::~Result_t((Result_t *)&local_80);
          iVar1 = *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket;
          *(bool *)&TLVSet[2].m_Lookup = iVar1 == Kumu::RESULT_OK;
          if (-1 < iVar1) {
            pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                      MDD_GenericTrack_Sequence);
            TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
            Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
            Kumu::Result_t::~Result_t((Result_t *)&local_80);
            *(bool *)&TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                 = *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket ==
                   Kumu::RESULT_OK;
          }
        }
      }
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x2d7,
                "virtual ASDCP::Result_t ASDCP::MXF::GenericTrack::InitFromTLVSet(TLVReader &)");
}

Assistant:

ASDCP::Result_t
GenericTrack::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = InterchangeObject::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(GenericTrack, TrackID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(GenericTrack, TrackNumber));
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(GenericTrack, TrackName));
    TrackName.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(GenericTrack, Sequence));
    Sequence.set_has_value( result == RESULT_OK );
  }
  return result;
}